

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O0

bool __thiscall
slang::ast::SystemSubroutine::noHierarchical
          (SystemSubroutine *this,EvalContext *context,Expression *expr)

{
  SourceRange range;
  bool bVar1;
  EvalContext *in_RSI;
  undefined8 in_RDI;
  DiagCode unaff_retaddr;
  Compilation *in_stack_ffffffffffffff98;
  Diagnostic *in_stack_ffffffffffffffa0;
  byte local_41;
  bitmask<slang::ast::EvalFlags> local_25;
  bitmask<slang::ast::CompilationFlags> local_24 [3];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = Expression::hasHierarchicalReference((Expression *)in_stack_ffffffffffffffa0);
  local_41 = 0;
  if (bVar1) {
    EvalContext::getCompilation((EvalContext *)0xa7f860);
    bitmask<slang::ast::CompilationFlags>::bitmask(local_24,AllowHierarchicalConst);
    bVar1 = Compilation::hasFlag
                      (in_stack_ffffffffffffff98,
                       (bitmask<slang::ast::CompilationFlags>)
                       (underlying_type)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
    local_41 = 0;
    if (!bVar1) {
      in_stack_ffffffffffffffa0 = (Diagnostic *)&in_RSI->flags;
      bitmask<slang::ast::EvalFlags>::bitmask(&local_25,IsScript);
      bVar1 = bitmask<slang::ast::EvalFlags>::has
                        ((bitmask<slang::ast::EvalFlags> *)in_stack_ffffffffffffffa0,
                         (bitmask<slang::ast::EvalFlags> *)in_stack_ffffffffffffff98);
      local_41 = bVar1 ^ 0xff;
    }
  }
  bVar1 = (local_41 & 1) != 0;
  if (bVar1) {
    range.endLoc._0_7_ = in_stack_fffffffffffffff8;
    range.startLoc = (SourceLocation)in_RDI;
    range.endLoc._7_1_ = in_stack_ffffffffffffffff;
    EvalContext::addDiag(in_RSI,unaff_retaddr,range);
    Diagnostic::operator<<(in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98);
  }
  return !bVar1;
}

Assistant:

bool SystemSubroutine::noHierarchical(EvalContext& context, const Expression& expr) const {
    if (expr.hasHierarchicalReference() &&
        !context.getCompilation().hasFlag(CompilationFlags::AllowHierarchicalConst) &&
        !context.flags.has(EvalFlags::IsScript)) {
        context.addDiag(diag::SysFuncHierarchicalNotAllowed, expr.sourceRange) << name;
        return false;
    }

    return true;
}